

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall
pbrt::RealisticCamera::DrawRayPathFromScene
          (RealisticCamera *this,Ray *r,bool arrow,bool toOpticalIntercept)

{
  float fVar1;
  uint uVar2;
  LensElementInterface *pLVar3;
  LensElementInterface *pLVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar19 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  float fVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  Point3f PVar25;
  Vector3<float> VVar26;
  Float t;
  double local_d8;
  undefined4 local_cc;
  undefined1 local_c8 [16];
  Float va;
  float fStack_b4;
  float local_b0;
  undefined1 local_a8 [16];
  double local_98;
  undefined4 local_90;
  float local_8c;
  float vb;
  float local_80;
  Ray local_78;
  Tuple3<pbrt::Normal3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  undefined1 extraout_var [60];
  
  local_90 = (undefined4)CONCAT71(in_register_00000009,toOpticalIntercept);
  local_cc = (undefined4)CONCAT71(in_register_00000011,arrow);
  auVar16._0_4_ = LensFrontZ(this);
  auVar16._4_60_ = extraout_var;
  local_c8 = auVar16._0_16_;
  if ((DrawRayPathFromScene(pbrt::Ray_const&,bool,bool)::LensFromCamera == '\0') &&
     (iVar9 = __cxa_guard_acquire(&DrawRayPathFromScene(pbrt::Ray_const&,bool,bool)::LensFromCamera)
     , iVar9 != 0)) {
    Scale(&DrawRayPathFromScene::LensFromCamera,1.0,1.0,-1.0);
    __cxa_guard_release(&DrawRayPathFromScene(pbrt::Ray_const&,bool,bool)::LensFromCamera);
  }
  auVar13._8_4_ = 0x80000000;
  auVar13._0_8_ = 0x8000000080000000;
  auVar13._12_4_ = 0x80000000;
  local_c8 = vxorps_avx512vl(local_c8,auVar13);
  lVar11 = 0;
  Transform::operator()(&local_78,&DrawRayPathFromScene::LensFromCamera,r,(Float *)0x0);
  uVar12 = 0;
  fVar20 = (float)local_c8._0_4_;
  uVar21 = local_c8._4_4_;
  uVar22 = local_c8._8_4_;
  uVar23 = local_c8._12_4_;
  while( true ) {
    if ((this->elementInterfaces).nStored <= uVar12) {
      if ((char)local_90 == '\0') {
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar13 = vxorps_avx512vl(ZEXT416((uint)local_78.o.super_Tuple3<pbrt::Point3,_float>.z),
                                  auVar14);
        local_c8._0_4_ = auVar13._0_4_ / local_78.d.super_Tuple3<pbrt::Vector3,_float>.z;
      }
      else {
        auVar7._8_4_ = 0x80000000;
        auVar7._0_8_ = 0x8000000080000000;
        auVar7._12_4_ = 0x80000000;
        auVar13 = vxorps_avx512vl(ZEXT416((uint)local_78.o.super_Tuple3<pbrt::Point3,_float>.x),
                                  auVar7);
        local_c8._0_4_ = auVar13._0_4_ / local_78.d.super_Tuple3<pbrt::Vector3,_float>.x;
        PVar25 = Ray::operator()(&local_78,(Float)local_c8._0_4_);
        local_a8._0_8_ = (double)PVar25.super_Tuple3<pbrt::Point3,_float>.z;
        PVar25 = Ray::operator()(&local_78,(Float)local_c8._0_4_);
        printf("Point[{%f, %f}], ",local_a8._0_8_,(double)PVar25.super_Tuple3<pbrt::Point3,_float>.x
              );
      }
      local_d8 = (double)local_78.o.super_Tuple3<pbrt::Point3,_float>.x;
      pcVar10 = "Line";
      local_a8._0_8_ = (double)local_78.o.super_Tuple3<pbrt::Point3,_float>.z;
      if ((char)local_cc != '\0') {
        pcVar10 = "Arrow";
      }
      PVar25 = Ray::operator()(&local_78,(Float)local_c8._0_4_);
      local_98 = (double)PVar25.super_Tuple3<pbrt::Point3,_float>.z;
      PVar25 = Ray::operator()(&local_78,(Float)local_c8._0_4_);
      printf("%s[{{%f, %f}, {%f, %f}}]",local_a8._0_8_,local_d8,local_98,
             (double)PVar25.super_Tuple3<pbrt::Point3,_float>.x,pcVar10);
      return;
    }
    pLVar3 = (this->elementInterfaces).ptr;
    local_c8._4_4_ = uVar21;
    local_c8._0_4_ = fVar20;
    local_c8._8_4_ = uVar22;
    local_c8._12_4_ = uVar23;
    local_8c = *(float *)((long)&pLVar3->curvatureRadius + lVar11);
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_50.z = 0.0;
    if ((local_8c != 0.0) || (NAN(local_8c))) {
      bVar8 = IntersectSphericalElement
                        (local_8c,fVar20 + local_8c,&local_78,&t,(Normal3f *)&local_50);
      if (!bVar8) {
        return;
      }
    }
    else {
      auVar6._8_4_ = 0x80000000;
      auVar6._0_8_ = 0x8000000080000000;
      auVar6._12_4_ = 0x80000000;
      auVar13 = vxorps_avx512vl(ZEXT416((uint)(local_78.o.super_Tuple3<pbrt::Point3,_float>.z -
                                              fVar20)),auVar6);
      t = auVar13._0_4_ / local_78.d.super_Tuple3<pbrt::Vector3,_float>.z;
    }
    _vb = _vb & 0xffffffff00000000;
    _va = CONCAT44(fStack_b4,t);
    if (t < 0.0) break;
    local_a8._0_8_ = (double)local_78.o.super_Tuple3<pbrt::Point3,_float>.z;
    local_d8 = (double)local_78.o.super_Tuple3<pbrt::Point3,_float>.x;
    PVar25 = Ray::operator()(&local_78,t);
    local_98 = (double)PVar25.super_Tuple3<pbrt::Point3,_float>.z;
    PVar25 = Ray::operator()(&local_78,t);
    printf("Line[{{%f, %f}, {%f, %f}}],",local_a8._0_8_,local_d8,local_98,
           (double)PVar25.super_Tuple3<pbrt::Point3,_float>.x);
    auVar19 = (undefined1  [56])0x0;
    PVar25 = Ray::operator()(&local_78,t);
    local_78.o.super_Tuple3<pbrt::Point3,_float>.z = PVar25.super_Tuple3<pbrt::Point3,_float>.z;
    auVar17._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar17._8_56_ = auVar19;
    fVar20 = *(float *)((long)&pLVar3->apertureRadius + lVar11);
    auVar14 = auVar17._0_16_;
    auVar24._0_4_ =
         PVar25.super_Tuple3<pbrt::Point3,_float>.x * PVar25.super_Tuple3<pbrt::Point3,_float>.x;
    auVar24._4_4_ =
         PVar25.super_Tuple3<pbrt::Point3,_float>.y * PVar25.super_Tuple3<pbrt::Point3,_float>.y;
    auVar24._8_4_ = auVar19._0_4_ * auVar19._0_4_;
    auVar24._12_4_ = auVar19._4_4_ * auVar19._4_4_;
    auVar13 = vmovshdup_avx(auVar24);
    auVar13 = vfmadd231ss_fma(auVar13,auVar14,auVar14);
    if (fVar20 * fVar20 < auVar13._0_4_) {
      return;
    }
    local_78.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar14);
    if ((local_8c != 0.0) || (NAN(local_8c))) {
      _va = 0;
      local_b0 = 0.0;
      pLVar4 = (this->elementInterfaces).ptr;
      fVar20 = 1.0;
      if (uVar12 != 0) {
        fVar1 = *(float *)((long)pLVar4 + lVar11 + -8);
        if ((fVar1 != 0.0) || (fVar20 = 1.0, NAN(fVar1))) {
          fVar20 = fVar1;
        }
      }
      uVar2 = *(uint *)((long)&pLVar4->eta + lVar11);
      local_d8 = (double)CONCAT44(local_d8._4_4_,fVar20);
      uVar5 = vcmpss_avx512f(ZEXT416(uVar2),ZEXT816(0) << 0x20,4);
      bVar8 = (bool)((byte)uVar5 & 1);
      local_a8 = ZEXT416(bVar8 * uVar2 + (uint)!bVar8 * 0x3f800000);
      auVar15._0_8_ = local_78.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
      auVar15._8_4_ = 0x80000000;
      auVar15._12_4_ = 0x80000000;
      auVar19 = ZEXT856(auVar15._8_8_);
      local_40.z = -local_78.d.super_Tuple3<pbrt::Vector3,_float>.z;
      local_40._0_8_ = vmovlps_avx(auVar15);
      VVar26 = Normalize<float>((Vector3<float> *)&local_40);
      local_80 = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar19;
      _vb = vmovlps_avx(auVar18._0_16_);
      bVar8 = Refract((Vector3f *)&vb,(Normal3f *)&local_50,(float)local_a8._0_4_ / local_d8._0_4_,
                      (Vector3f *)&va);
      if (!bVar8) {
        return;
      }
      local_78.d.super_Tuple3<pbrt::Vector3,_float>.z = local_b0;
      local_78.d.super_Tuple3<pbrt::Vector3,_float>.x = va;
      local_78.d.super_Tuple3<pbrt::Vector3,_float>.y = fStack_b4;
    }
    uVar12 = uVar12 + 1;
    fVar20 = (float)local_c8._0_4_ + *(float *)((long)&pLVar3->thickness + lVar11);
    uVar21 = 0;
    uVar22 = 0;
    uVar23 = 0;
    lVar11 = lVar11 + 0x10;
  }
  LogFatal<char_const(&)[2],char_const(&)[4],char_const(&)[2],float&,char_const(&)[4],float&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
             ,0x4a4,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [2])0x490af8,
             (char (*) [4])"0.f",(char (*) [2])0x490af8,&va,(char (*) [4])"0.f",&vb);
}

Assistant:

void RealisticCamera::DrawRayPathFromScene(const Ray &r, bool arrow,
                                           bool toOpticalIntercept) const {
    Float elementZ = LensFrontZ() * -1;

    // Transform _ray_ from camera to lens system space
    static const Transform LensFromCamera = Scale(1, 1, -1);
    Ray ray = LensFromCamera(r);
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        bool isStop = (element.curvatureRadius == 0);
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        if (isStop)
            t = -(ray.o.z - elementZ) / ray.d.z;
        else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, ray, &t, &n))
                return;
        }
        CHECK_GE(t, 0.f);

        printf("Line[{{%f, %f}, {%f, %f}}],", ray.o.z, ray.o.x, ray(t).z, ray(t).x);

        // Test intersection point against element aperture
        Point3f pHit = ray(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        Float apertureRadius2 = element.apertureRadius * element.apertureRadius;
        if (r2 > apertureRadius2)
            return;
        ray.o = pHit;

        // Update ray path for from-scene element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = (i == 0 || elementInterfaces[i - 1].eta == 0.f)
                              ? 1.f
                              : elementInterfaces[i - 1].eta;
            Float eta_t =
                (elementInterfaces[i].eta != 0.f) ? elementInterfaces[i].eta : 1.f;
            if (!Refract(Normalize(-ray.d), n, eta_t / eta_i, &wt))
                return;
            ray.d = wt;
        }
        elementZ += element.thickness;
    }

    // go to the film plane by default
    {
        Float ta = -ray.o.z / ray.d.z;
        if (toOpticalIntercept) {
            ta = -ray.o.x / ray.d.x;
            printf("Point[{%f, %f}], ", ray(ta).z, ray(ta).x);
        }
        printf("%s[{{%f, %f}, {%f, %f}}]", arrow ? "Arrow" : "Line", ray.o.z, ray.o.x,
               ray(ta).z, ray(ta).x);
    }
}